

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-curse.c
# Opt level: O0

int16_t modify_weight_for_curse(wchar_t i,int16_t weight)

{
  object *poVar1;
  _Bool _Var2;
  int iVar3;
  short local_34;
  int local_2c;
  int local_28;
  int local_20;
  int32_t q;
  int32_t scaled;
  int16_t result;
  object *curse_obj;
  int16_t weight_local;
  wchar_t i_local;
  
  if ((L'\xffffffff' < i) && (i < (int)(uint)z_info->curse_max)) {
    poVar1 = curses[i].obj;
    _Var2 = flag_has_dbg(poVar1->flags,6,0x2c,"curse_obj->flags","OF_MULTIPLY_WEIGHT");
    if (_Var2) {
      if (poVar1->weight < 0) {
        __assert_fail("curse_obj->weight >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-curse.c"
                      ,0x193,"int16_t modify_weight_for_curse(int, int16_t)");
      }
      if (poVar1->weight < 0x65) {
        if (weight < 0) {
          local_2c = 0;
        }
        else {
          local_2c = (int)weight;
        }
        local_20 = local_2c;
      }
      else {
        if (weight < 1) {
          local_28 = 1;
        }
        else {
          local_28 = (int)weight;
        }
        local_20 = local_28;
      }
      local_20 = poVar1->weight * local_20;
      iVar3 = local_20 / 100;
      if (iVar3 < 0x7fff) {
        q._2_2_ = (short)iVar3;
        if (0x31 < local_20 % 100) {
          q._2_2_ = q._2_2_ + 1;
        }
      }
      else {
        q._2_2_ = 0x7fff;
      }
    }
    else {
      if (weight < 1) {
        weight = 0;
      }
      if (poVar1->weight < 0) {
        q._2_2_ = weight + poVar1->weight;
        if (q._2_2_ < 0) {
          q._2_2_ = 0;
        }
      }
      else {
        if ((int)weight < 0x7fff - poVar1->weight) {
          local_34 = weight + poVar1->weight;
        }
        else {
          local_34 = 0x7fff;
        }
        q._2_2_ = local_34;
      }
    }
    return q._2_2_;
  }
  __assert_fail("i >= 0 && i < z_info->curse_max",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-curse.c"
                ,0x186,"int16_t modify_weight_for_curse(int, int16_t)");
}

Assistant:

int16_t modify_weight_for_curse(int i, int16_t weight)
{
	const struct object *curse_obj;
	int16_t result;

	assert(i >= 0 && i < z_info->curse_max);
	curse_obj = curses[i].obj;

	if (of_has(curse_obj->flags, OF_MULTIPLY_WEIGHT)) {
		/*
		 * Apply a multiplicative factor of curse_obj->weight over 100
		 * and round to the nearest integer.  Coerce the incoming weight
		 * to be at least one if the multiplicative factor is greater
		 * than one.  That allows multiplicative factors to be of some
		 * use with otherwise weightless items.
		 */
		int32_t scaled, q;

		assert(curse_obj->weight >= 0);
		if (curse_obj->weight > 100) {
			scaled = MAX(weight, 1);
		} else {
			scaled = MAX(weight, 0);
		}
		scaled *= curse_obj->weight;
		q = scaled / 100;
		if (q < 32767) {
			result = q;
			if (scaled % 100 >= 50) {
				++result;
			}
		} else {
			result = 32767;
		}
	} else {
		weight = MAX(0, weight);
		if (curse_obj->weight < 0) {
			result = weight + curse_obj->weight;
			if (result < 0) {
				result = 0;
			}
		} else {
			result = (weight < 32767 - curse_obj->weight) ?
				weight + curse_obj->weight : 32767;
		}
	}

	return result;
}